

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O3

CheckedError __thiscall
flatbuffers::EnumValBuilder::ValidateImpl<(flatbuffers::BaseType)6,unsigned_short>
          (EnumValBuilder *this,int64_t *ev,int m)

{
  long t;
  string *msg;
  long *plVar1;
  undefined8 *puVar2;
  int in_ECX;
  long *plVar3;
  ulong *puVar4;
  undefined4 in_register_00000014;
  ulong uVar5;
  long *local_f0;
  long local_e0;
  undefined8 uStack_d8;
  ulong *local_d0;
  long local_c8;
  ulong local_c0;
  long lStack_b8;
  ulong *local_b0;
  long local_a8;
  ulong local_a0 [2];
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  string local_50;
  
  t = *(long *)CONCAT44(in_register_00000014,m);
  if ((-1 < t) && (t <= 0xffff - (long)in_ECX)) {
    *(long *)CONCAT44(in_register_00000014,m) = t + in_ECX;
    *(undefined2 *)&this->parser = 0;
    goto LAB_0012d6e5;
  }
  msg = (string *)*ev;
  NumToString<long>(&local_50,t);
  plVar1 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x151fc0);
  plVar3 = plVar1 + 2;
  if ((long *)*plVar1 == plVar3) {
    local_80 = *plVar3;
    lStack_78 = plVar1[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar3;
    local_90 = (long *)*plVar1;
  }
  local_88 = plVar1[1];
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_90);
  plVar3 = plVar1 + 2;
  if ((long *)*plVar1 == plVar3) {
    local_60 = *plVar3;
    lStack_58 = plVar1[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar3;
    local_70 = (long *)*plVar1;
  }
  local_68 = plVar1[1];
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_70);
  puVar4 = (ulong *)(plVar1 + 2);
  if ((ulong *)*plVar1 == puVar4) {
    local_c0 = *puVar4;
    lStack_b8 = plVar1[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *puVar4;
    local_d0 = (ulong *)*plVar1;
  }
  local_c8 = plVar1[1];
  *plVar1 = (long)puVar4;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  anon_unknown_0::TypeToIntervalString<unsigned_short>();
  uVar5 = 0xf;
  if (local_d0 != &local_c0) {
    uVar5 = local_c0;
  }
  if (uVar5 < (ulong)(local_a8 + local_c8)) {
    uVar5 = 0xf;
    if (local_b0 != local_a0) {
      uVar5 = local_a0[0];
    }
    if (uVar5 < (ulong)(local_a8 + local_c8)) goto LAB_0012d5d2;
    puVar2 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_d0);
  }
  else {
LAB_0012d5d2:
    puVar2 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_b0);
  }
  local_f0 = &local_e0;
  plVar1 = puVar2 + 2;
  if ((long *)*puVar2 == plVar1) {
    local_e0 = *plVar1;
    uStack_d8 = puVar2[3];
  }
  else {
    local_e0 = *plVar1;
    local_f0 = (long *)*puVar2;
  }
  *puVar2 = plVar1;
  puVar2[1] = 0;
  *(undefined1 *)plVar1 = 0;
  Parser::Error((Parser *)this,msg);
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0,local_a0[0] + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
LAB_0012d6e5:
  return SUB82(this,0);
}

Assistant:

inline FLATBUFFERS_CHECKED_ERROR ValidateImpl(int64_t *ev, int m) {
    typedef typename EnumHelper::EnumValType<E>::type T;  // int64_t or uint64_t
    static_assert(sizeof(T) == sizeof(int64_t), "invalid EnumValType");
    const auto v = static_cast<T>(*ev);
    auto up = static_cast<T>((flatbuffers::numeric_limits<CTYPE>::max)());
    auto dn = static_cast<T>((flatbuffers::numeric_limits<CTYPE>::lowest)());
    if (v < dn || v > (up - m)) {
      return parser.Error("enum value does not fit, \"" + NumToString(v) +
                          (m ? " + 1\"" : "\"") + " out of " +
                          TypeToIntervalString<CTYPE>());
    }
    *ev = static_cast<int64_t>(v + m);  // well-defined since C++20.
    return NoError();
  }